

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParseAuthorityTwoW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast)

{
  UriUriW *pUVar1;
  wchar_t *pwVar2;
  
  pwVar2 = afterLast;
  if ((first < afterLast) && (pwVar2 = first, *first == L':')) {
    pwVar2 = uriParsePortW((UriParserStateW *)(first + 1),afterLast,afterLast);
    if (pwVar2 == (wchar_t *)0x0) {
      pwVar2 = (wchar_t *)0x0;
    }
    else {
      pUVar1 = state->uri;
      (pUVar1->portText).first = first + 1;
      (pUVar1->portText).afterLast = pwVar2;
    }
  }
  return pwVar2;
}

Assistant:

static URI_INLINE const URI_CHAR * URI_FUNC(ParseAuthorityTwo)(URI_TYPE(ParserState) * state, const URI_CHAR * first, const URI_CHAR * afterLast) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case _UT(':'):
		{
			const URI_CHAR * const afterPort = URI_FUNC(ParsePort)(state, first + 1, afterLast);
			if (afterPort == NULL) {
				return NULL;
			}
			state->uri->portText.first = first + 1; /* PORT BEGIN */
			state->uri->portText.afterLast = afterPort; /* PORT END */
			return afterPort;
		}

	default:
		return first;
	}
}